

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  int iVar1;
  string *delim;
  string *psVar2;
  string *psVar3;
  string *psVar4;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  EnumDescriptor *extraout_RDX_01;
  EnumDescriptor *descriptor_00;
  EnumDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *pFVar5;
  FieldDescriptor *extraout_RDX_05;
  int i_1;
  int i;
  long lVar6;
  char *pcVar7;
  int i_3;
  long lVar8;
  ulong uVar9;
  string sStack_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  
  delim = &sStack_88;
  psVar2 = &sStack_88;
  psVar3 = &sStack_88;
  psVar4 = &sStack_88;
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x4b) == '\x01') {
    io::Printer::Print<>(printer,"null, ");
    return;
  }
  GetClassName_abi_cxx11_(&sStack_88,(csharp *)descriptor,(Descriptor *)printer);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
             (char (*) [10])0x3a8994,&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  if ((long)*(int *)(descriptor + 0x68) < 1) {
    io::Printer::Print<>(printer,"null, ");
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&fields,(long)*(int *)(descriptor + 0x68));
    lVar8 = 0;
    pFVar5 = extraout_RDX;
    for (lVar6 = 0; lVar6 < *(int *)(descriptor + 0x68); lVar6 = lVar6 + 1) {
      GetPropertyName_abi_cxx11_(&sStack_88,(csharp *)(*(long *)(descriptor + 0x28) + lVar8),pFVar5)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      lVar8 = lVar8 + 0x98;
      pFVar5 = extraout_RDX_00;
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&sStack_88,(protobuf *)&fields,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"\", \"",(char *)delim);
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,"new[]{ \"$fields$\" }, ",(char (*) [7])0x3e5e8b,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
    delim = psVar2;
  }
  if ((long)*(int *)(descriptor + 0x6c) < 1) {
    io::Printer::Print<>(printer,"null, ");
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&fields,(long)*(int *)(descriptor + 0x6c));
    lVar8 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(descriptor + 0x6c); lVar6 = lVar6 + 1) {
      UnderscoresToCamelCase(&sStack_88,*(string **)(*(long *)(descriptor + 0x30) + lVar8),true);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      lVar8 = lVar8 + 0x30;
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&sStack_88,(protobuf *)&fields,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"\", \"",(char *)delim);
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,"new[]{ \"$oneofs$\" }, ",(char (*) [7])"oneofs",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
    delim = psVar3;
  }
  if ((long)*(int *)(descriptor + 0x74) < 1) {
    io::Printer::Print<>(printer,"null, ");
    pFVar5 = extraout_RDX_04;
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&fields,(long)*(int *)(descriptor + 0x74));
    lVar8 = 0;
    descriptor_00 = extraout_RDX_01;
    for (lVar6 = 0; lVar6 < *(int *)(descriptor + 0x74); lVar6 = lVar6 + 1) {
      GetClassName_abi_cxx11_
                (&sStack_88,(csharp *)(*(long *)(descriptor + 0x40) + lVar8),descriptor_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      lVar8 = lVar8 + 0x50;
      descriptor_00 = extraout_RDX_02;
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&sStack_88,(protobuf *)&fields,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"), typeof(",(char *)delim);
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,"new[]{ typeof($enums$) }, ",(char (*) [6])0x3969b3,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
    delim = psVar4;
    pFVar5 = extraout_RDX_03;
  }
  iVar1 = *(int *)(descriptor + 0x7c);
  if (iVar1 < 1) {
    io::Printer::Print<>(printer,"null, ");
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < iVar1; lVar8 = lVar8 + 1) {
      GetFullExtensionName_abi_cxx11_
                (&sStack_88,(csharp *)(*(long *)(descriptor + 0x50) + lVar6),pFVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      iVar1 = *(int *)(descriptor + 0x7c);
      lVar6 = lVar6 + 0x98;
      pFVar5 = extraout_RDX_05;
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&sStack_88,(protobuf *)&fields,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x3ab4e0,(char *)delim);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"new pb::Extension[] { $extensions$ }, ",(char (*) [11])0x396da4,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
  }
  if (*(int *)(descriptor + 0x70) < 1) {
    pcVar7 = "null";
  }
  else {
    io::Printer::Print<>(printer,"new pbr::GeneratedClrTypeInfo[] { ");
    lVar6 = 0;
    pcVar7 = "}";
    for (uVar9 = 0; (long)uVar9 < (long)*(int *)(descriptor + 0x70); uVar9 = uVar9 + 1) {
      WriteGeneratedCodeInfo
                (this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar6),printer,
                 uVar9 == *(int *)(descriptor + 0x70) - 1);
      lVar6 = lVar6 + 0x90;
    }
  }
  io::Printer::Print<>(printer,pcVar7);
  pcVar7 = "),\n";
  if (last) {
    pcVar7 = ")";
  }
  io::Printer::Print<>(printer,pcVar7);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));

  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      fields.reserve(descriptor->field_count());
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", Join(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      oneofs.reserve(descriptor->oneof_decl_count());
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", Join(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      enums.reserve(descriptor->enum_type_count());
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", Join(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Extensions
  if (descriptor->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < descriptor->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(descriptor->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null.
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}